

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::SetNode::do_render(SetNode *this,ostringstream *param_2,shared_ptr<minja::Context> *context)

{
  bool bVar1;
  runtime_error *prVar2;
  ulong uVar3;
  size_type sVar4;
  element_type *peVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Value *in_RDI;
  Value val;
  Value ns_value;
  value_type *name;
  Value *in_stack_fffffffffffffdc0;
  Value *this_00;
  string *in_stack_fffffffffffffde8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe00;
  element_type *in_stack_fffffffffffffe08;
  Value *in_stack_fffffffffffffe70;
  Value *in_stack_fffffffffffffe78;
  Value *in_stack_fffffffffffffe80;
  Value *in_stack_fffffffffffffea0;
  shared_ptr<minja::Context> *in_stack_fffffffffffffea8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffeb0;
  string local_f0 [32];
  undefined1 local_d0 [80];
  undefined1 local_80 [32];
  shared_ptr<minja::Context> *in_stack_ffffffffffffffa0;
  Expression *in_stack_ffffffffffffffa8;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &in_RDI[1].super_enable_shared_from_this<minja::Value>._M_weak_this.
                      super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"SetNode.value is null");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&in_RDI->primitive_);
    if (sVar4 != 1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar2,"Namespaced set only supports a single variable name");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&in_RDI->primitive_,0);
    peVar5 = std::__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x321186);
    Value::Value(in_RDI,in_stack_fffffffffffffde8);
    (*peVar5->_vptr_Context[2])(local_80,peVar5,local_d0);
    Value::~Value(in_stack_fffffffffffffdc0);
    bVar1 = Value::is_object((Value *)0x3211dd);
    if (!bVar1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::operator+((char *)in_stack_fffffffffffffe08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe00._M_pi);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffdc0);
      std::runtime_error::runtime_error((runtime_error *)__lhs,local_f0);
      __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Value::Value(in_RDI,in_stack_fffffffffffffde8);
    std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x321332);
    Expression::evaluate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    Value::set(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    Value::~Value(in_stack_fffffffffffffdc0);
    Value::~Value(in_stack_fffffffffffffdc0);
    Value::~Value(in_stack_fffffffffffffdc0);
  }
  else {
    std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x32140e);
    this_00 = (Value *)&stack0xfffffffffffffdf8;
    Expression::evaluate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    destructuring_assign
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    Value::~Value(this_00);
  }
  return;
}

Assistant:

void do_render(std::ostringstream &, const std::shared_ptr<Context> & context) const override {
      if (!value) throw std::runtime_error("SetNode.value is null");
      if (!ns.empty()) {
        if (var_names.size() != 1) {
          throw std::runtime_error("Namespaced set only supports a single variable name");
        }
        auto & name = var_names[0];
        auto ns_value = context->get(ns);
        if (!ns_value.is_object()) throw std::runtime_error("Namespace '" + ns + "' is not an object");
        ns_value.set(name, this->value->evaluate(context));
      } else {
        auto val = value->evaluate(context);
        destructuring_assign(var_names, context, val);
      }
    }